

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrCMP0xc5(CPU *this)

{
  uint8_t reg;
  uint16_t addr;
  Memory *this_00;
  byte bVar1;
  uint8_t argument;
  
  reg = this->A;
  this_00 = this->m;
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this_00,addr);
  argument = Memory::Read8(this_00,(ushort)bVar1);
  CMP(this,reg,argument);
  return 3;
}

Assistant:

int CPU::instrCMP0xc5() {
	CMP(A, zeropage_addr());
	return 3;
}